

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void display_columns(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int pos_00;
  int local_5c;
  int iStack_50;
  _Bool is_cursor;
  int pos;
  int colw;
  int cols;
  int rows_per_page;
  int row;
  int col;
  int n;
  int h;
  int w;
  int r;
  int c;
  region_conflict *loc_local;
  int *top_local;
  menu_conflict *pmStack_10;
  int cursor_local;
  menu_conflict *menu_local;
  
  if (menu->filter_list == (int *)0x0) {
    local_5c = menu->count;
  }
  else {
    local_5c = menu->filter_count;
  }
  iVar1 = loc->col;
  iVar2 = loc->row;
  iVar3 = loc->page_rows;
  iVar4 = (local_5c + iVar3 + -1) / iVar3;
  iStack_50 = 0x17;
  _r = loc;
  loc_local = (region_conflict *)top;
  top_local._4_4_ = cursor;
  pmStack_10 = menu;
  Term_get_size(&n,&col);
  if (n - iVar1 < iVar4 * 0x17) {
    iStack_50 = (n - iVar1) / iVar4;
  }
  for (w = 0; w < iVar4; w = w + 1) {
    for (h = 0; h < iVar3; h = h + 1) {
      pos_00 = w * iVar3 + h;
      if (pos_00 < local_5c) {
        display_menu_row(pmStack_10,pos_00,0,pos_00 == top_local._4_4_,iVar2 + h,
                         iVar1 + w * iStack_50,iStack_50);
      }
    }
  }
  if (-1 < pmStack_10->cursor) {
    Term_gotoxy(iVar1 + (top_local._4_4_ / iVar3) * iStack_50 + pmStack_10->cursor_x_offset,
                (iVar2 + top_local._4_4_ % iVar3) - loc_local->col);
  }
  return;
}

Assistant:

static void display_columns(struct menu *menu, int cursor, int *top, region *loc)
{
	int c, r;
	int w, h;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int cols = (n + rows_per_page - 1) / rows_per_page;
	int colw = 23;

	Term_get_size(&w, &h);

	if ((colw * cols) > (w - col))
		colw = (w - col) / cols;

	for (c = 0; c < cols; c++) {
		for (r = 0; r < rows_per_page; r++) {
			int pos = c * rows_per_page + r;
			bool is_cursor = (pos == cursor);

			if (pos < n)
				display_menu_row(menu, pos, 0, is_cursor,
						row + r, col + c * colw, colw);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + (cursor / rows_per_page) * colw + menu->cursor_x_offset,
				row + (cursor % rows_per_page) - *top);
}